

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codewriter_p.h
# Opt level: O1

void __thiscall asmjit::v1_14::CodeWriter::remove8(CodeWriter *this,uint8_t *where)

{
  if (where < this->_cursor) goto LAB_00142d6c;
  remove8();
  do {
    where[-1] = *where;
LAB_00142d6c:
    where = where + 1;
  } while (where != this->_cursor);
  this->_cursor = this->_cursor + -1;
  return;
}

Assistant:

ASMJIT_FORCE_INLINE void remove8(uint8_t* where) noexcept {
    ASMJIT_ASSERT(where < _cursor);

    uint8_t* p = where;
    while (++p != _cursor)
      p[-1] = p[0];
    _cursor--;
  }